

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode urldecode_host(dynbuf *host)

{
  CURLcode CVar1;
  char *pcStack_38;
  CURLcode result;
  char *decoded;
  size_t dlen;
  char *hostname;
  char *per;
  dynbuf *host_local;
  
  hostname = (char *)0x0;
  per = (char *)host;
  dlen = (size_t)Curl_dyn_ptr(host);
  hostname = strchr((char *)dlen,0x25);
  if (hostname == (char *)0x0) {
    host_local._4_4_ = CURLUE_OK;
  }
  else {
    CVar1 = Curl_urldecode((char *)dlen,0,&stack0xffffffffffffffc8,(size_t *)&decoded,REJECT_CTRL);
    if (CVar1 == CURLE_OK) {
      Curl_dyn_reset((dynbuf *)per);
      CVar1 = Curl_dyn_addn((dynbuf *)per,pcStack_38,(size_t)decoded);
      (*Curl_cfree)(pcStack_38);
      if (CVar1 == CURLE_OK) {
        host_local._4_4_ = CURLUE_OK;
      }
      else {
        host_local._4_4_ = CURLUE_OUT_OF_MEMORY;
        if (CVar1 == CURLE_TOO_LARGE) {
          host_local._4_4_ = CURLUE_TOO_LARGE;
        }
      }
    }
    else {
      host_local._4_4_ = CURLUE_BAD_HOSTNAME;
    }
  }
  return host_local._4_4_;
}

Assistant:

static CURLUcode urldecode_host(struct dynbuf *host)
{
  char *per = NULL;
  const char *hostname = Curl_dyn_ptr(host);
  per = strchr(hostname, '%');
  if(!per)
    /* nothing to decode */
    return CURLUE_OK;
  else {
    /* encoded */
    size_t dlen;
    char *decoded;
    CURLcode result = Curl_urldecode(hostname, 0, &decoded, &dlen,
                                     REJECT_CTRL);
    if(result)
      return CURLUE_BAD_HOSTNAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addn(host, decoded, dlen);
    free(decoded);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}